

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O1

int __thiscall
LASreadItemCompressed_BYTE14_v4::init(LASreadItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  U32 context;
  ByteStreamIn *pBVar2;
  ByteStreamInArray **ppBVar3;
  ByteStreamInArray *pBVar4;
  ArithmeticDecoder **ppAVar5;
  ArithmeticDecoder *this_00;
  U8 *pUVar6;
  long lVar7;
  undefined7 extraout_var;
  U32 *in_RDX;
  BOOL BVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  pBVar2 = this->dec->instream;
  if (this->instream_Bytes == (ByteStreamInArray **)0x0) {
    uVar11 = (ulong)this->number;
    ppBVar3 = (ByteStreamInArray **)operator_new__(uVar11 * 8);
    this->instream_Bytes = ppBVar3;
    if (uVar11 != 0) {
      uVar9 = 0;
      do {
        pBVar4 = (ByteStreamInArray *)operator_new(0x38);
        (pBVar4->super_ByteStreamIn).bit_buffer = 0;
        (pBVar4->super_ByteStreamIn).num_buffer = 0;
        pBVar4->data = (U8 *)0x0;
        pBVar4->size = 0;
        pBVar4->curr = 0;
        pBVar4[1].super_ByteStreamIn._vptr_ByteStreamIn = (_func_int **)0x0;
        (pBVar4->super_ByteStreamIn)._vptr_ByteStreamIn = (_func_int **)&PTR_getByte_0015ea30;
        this->instream_Bytes[uVar9] = pBVar4;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    ppAVar5 = (ArithmeticDecoder **)operator_new__(uVar11 * 8);
    this->dec_Bytes = ppAVar5;
    if (this->number != 0) {
      uVar11 = 0;
      do {
        this_00 = (ArithmeticDecoder *)operator_new(0x10);
        ArithmeticDecoder::ArithmeticDecoder(this_00);
        this->dec_Bytes[uVar11] = this_00;
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->number);
    }
  }
  if ((ulong)this->number == 0) {
    uVar10 = 0;
  }
  else {
    uVar11 = 0;
    uVar10 = 0;
    do {
      if (this->requested_Bytes[uVar11] == true) {
        uVar10 = uVar10 + this->num_bytes_Bytes[uVar11];
      }
      uVar11 = uVar11 + 1;
    } while (this->number != uVar11);
  }
  if (this->num_bytes_allocated < uVar10) {
    if (this->bytes != (U8 *)0x0) {
      operator_delete__(this->bytes);
    }
    pUVar6 = (U8 *)operator_new__((ulong)uVar10);
    this->bytes = pUVar6;
    this->num_bytes_allocated = uVar10;
  }
  if (this->number != 0) {
    uVar11 = 0;
    uVar10 = 0;
    do {
      if (this->requested_Bytes[uVar11] == true) {
        if (this->num_bytes_Bytes[uVar11] == 0) {
          BVar8 = false;
          ArithmeticDecoder::init(this->dec_Bytes[uVar11],(EVP_PKEY_CTX *)0x0);
        }
        else {
          (*pBVar2->_vptr_ByteStreamIn[1])(pBVar2,this->bytes + uVar10);
          pBVar4 = this->instream_Bytes[uVar11];
          pUVar6 = this->bytes;
          uVar1 = this->num_bytes_Bytes[uVar11];
          pBVar4->curr = 0;
          if (pUVar6 == (U8 *)0x0) {
            pBVar4->data = (U8 *)0x0;
            pBVar4->size = 0;
          }
          else {
            pBVar4->data = pUVar6 + uVar10;
            pBVar4->size = (ulong)uVar1;
          }
          ArithmeticDecoder::init
                    (this->dec_Bytes[uVar11],(EVP_PKEY_CTX *)this->instream_Bytes[uVar11]);
          uVar10 = uVar10 + this->num_bytes_Bytes[uVar11];
          BVar8 = true;
        }
      }
      else {
        if (this->num_bytes_Bytes[uVar11] != 0) {
          (*pBVar2->_vptr_ByteStreamIn[0xc])(pBVar2);
        }
        BVar8 = false;
      }
      this->changed_Bytes[uVar11] = BVar8;
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->number);
  }
  lVar7 = 0x48;
  do {
    *(undefined1 *)
     ((long)&(((LASreadItemCompressed_BYTE14_v4 *)(this->contexts + -3))->
             super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem + lVar7) = 1;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0xa8);
  context = *in_RDX;
  this->current_context = context;
  createAndInitModelsAndDecompressors(this,context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASreadItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* for layered compression 'dec' only hands over the stream */

  ByteStreamIn* instream = dec->getByteStreamIn();

  /* on the first init create instreams and decoders */

  if (instream_Bytes == 0)
  {
    /* create instream pointer array */

    instream_Bytes = new ByteStreamInArray*[number];

    /* create instreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayBE();
      }
    }

    /* create decoder pointer array */

    dec_Bytes = new ArithmeticDecoder*[number];

    /* create layer decoders */

    for (i = 0; i < number; i++)
    {
      dec_Bytes[i] = new ArithmeticDecoder();
    }
  }

  /* how many bytes do we need to read */

  U32 num_bytes = 0;

  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i]) num_bytes += num_bytes_Bytes[i];
  }

  /* make sure the buffer is sufficiently large */

  if (num_bytes > num_bytes_allocated)
  {
    if (bytes) delete [] bytes;
    bytes = new U8[num_bytes];
    if (bytes == 0) return FALSE;
    num_bytes_allocated = num_bytes;
  }

  /* load the requested bytes and init the corresponding instreams an decoders */

  num_bytes = 0;
  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i])
    {
      if (num_bytes_Bytes[i])
      {
        instream->getBytes(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        instream_Bytes[i]->init(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        dec_Bytes[i]->init(instream_Bytes[i]);
        num_bytes += num_bytes_Bytes[i];
        changed_Bytes[i] = TRUE;
      }
      else
      {
        dec_Bytes[i]->init(0, 0);
        changed_Bytes[i] = FALSE;
      }
    }
    else
    {
      if (num_bytes_Bytes[i])
      {
        instream->skipBytes(num_bytes_Bytes[i]);
      }
      changed_Bytes[i] = FALSE;
    }
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 reader

  /* create and init models and decompressors */

  createAndInitModelsAndDecompressors(current_context, item);

  return TRUE;
}